

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O1

void __thiscall
TTD::TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::FunctionBodyResolveInfo_*>::AddItem
          (TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::FunctionBodyResolveInfo_*>
           *this,unsigned_long id,FunctionBodyResolveInfo **item)

{
  Entry *pEVar1;
  
  if (this->m_count * 2 < this->m_capacity) {
    pEVar1 = FindSlotForId<true>(this,id);
    pEVar1->Key = id;
    pEVar1->Data = *item;
    this->m_count = this->m_count + 1;
    return;
  }
  TTDAbort_unrecoverable_error
            ("The dictionary is being sized incorrectly and will likely have poor performance");
}

Assistant:

void AddItem(Tag id, const T& item)
        {
            TTDAssert(this->m_count * TTD_DICTIONARY_LOAD_FACTOR < this->m_capacity, "The dictionary is being sized incorrectly and will likely have poor performance");
            Entry* entry = this->FindSlotForId<true>(id);

            InitializeEntry(entry, id, item);
            this->m_count++;
        }